

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O1

void progressbarinit(ProgressData *bar,OperationConfig *config)

{
  uint uVar1;
  
  bar->initial_size = 0;
  bar->tick = 0;
  bar->bar = 0;
  *(undefined8 *)&bar->width = 0;
  bar->out = (FILE *)0x0;
  (bar->prevtime).tv_sec = 0;
  *(undefined8 *)&(bar->prevtime).tv_usec = 0;
  *(undefined8 *)bar = 0;
  bar->prev = 0;
  *(undefined8 *)&bar->barmove = 0;
  if ((config->field_0x4e4 & 0x10) != 0) {
    bar->initial_size = config->resume_from;
  }
  uVar1 = get_terminal_columns();
  if ((int)uVar1 < 0x191) {
    if ((int)uVar1 < 0x15) {
      bar->width = 0x14;
    }
    else {
      bar->width = uVar1;
    }
  }
  else {
    bar->width = 400;
  }
  bar->out = tool_stderr;
  bar->tick = 0x96;
  bar->barmove = 1;
  return;
}

Assistant:

void progressbarinit(struct ProgressData *bar,
                     struct OperationConfig *config)
{
  memset(bar, 0, sizeof(struct ProgressData));

  /* pass the resume from value through to the progress function so it can
   * display progress towards total file not just the part that is left. */
  if(config->use_resume)
    bar->initial_size = config->resume_from;

  update_width(bar);

  bar->out = tool_stderr;
  bar->tick = 150;
  bar->barmove = 1;
}